

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr GetOperatorName(InplaceStr name)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  InplaceStr IVar4;
  InplaceStr local_20;
  InplaceStr local_10;
  
  local_20.begin = "+";
  local_20.end = "";
  bVar1 = InplaceStr::operator==(&local_10,&local_20);
  if (bVar1) {
    pcVar2 = "__operatorAdd";
    pcVar3 = "";
  }
  else {
    local_20.begin = "-";
    local_20.end = "";
    bVar1 = InplaceStr::operator==(&local_10,&local_20);
    if (bVar1) {
      pcVar2 = "__operatorSub";
      pcVar3 = "";
    }
    else {
      local_20.begin = "*";
      local_20.end = "";
      bVar1 = InplaceStr::operator==(&local_10,&local_20);
      if (bVar1) {
        pcVar2 = "__operatorMul";
        pcVar3 = "";
      }
      else {
        local_20.begin = "/";
        local_20.end = "";
        bVar1 = InplaceStr::operator==(&local_10,&local_20);
        if (bVar1) {
          pcVar2 = "__operatorDiv";
          pcVar3 = "";
        }
        else {
          local_20.begin = "%";
          local_20.end = "";
          bVar1 = InplaceStr::operator==(&local_10,&local_20);
          if (bVar1) {
            pcVar2 = "__operatorMod";
            pcVar3 = "";
          }
          else {
            local_20.begin = "**";
            local_20.end = "";
            bVar1 = InplaceStr::operator==(&local_10,&local_20);
            if (bVar1) {
              pcVar2 = "__operatorPow";
              pcVar3 = "";
            }
            else {
              local_20.begin = "<";
              local_20.end = "";
              bVar1 = InplaceStr::operator==(&local_10,&local_20);
              if (bVar1) {
                pcVar2 = "__operatorLess";
                pcVar3 = "";
              }
              else {
                local_20.begin = ">";
                local_20.end = "";
                bVar1 = InplaceStr::operator==(&local_10,&local_20);
                if (bVar1) {
                  pcVar2 = "__operatorGreater";
                  pcVar3 = "";
                }
                else {
                  local_20.begin = "<=";
                  local_20.end = "";
                  bVar1 = InplaceStr::operator==(&local_10,&local_20);
                  if (bVar1) {
                    pcVar2 = "__operatorLEqual";
                    pcVar3 = "";
                  }
                  else {
                    local_20.begin = ">=";
                    local_20.end = "";
                    bVar1 = InplaceStr::operator==(&local_10,&local_20);
                    if (bVar1) {
                      pcVar2 = "__operatorGEqual";
                      pcVar3 = "";
                    }
                    else {
                      local_20.begin = "==";
                      local_20.end = "";
                      bVar1 = InplaceStr::operator==(&local_10,&local_20);
                      if (bVar1) {
                        pcVar2 = "__operatorEqual";
                        pcVar3 = "";
                      }
                      else {
                        local_20.begin = "!=";
                        local_20.end = "";
                        bVar1 = InplaceStr::operator==(&local_10,&local_20);
                        if (bVar1) {
                          pcVar2 = "__operatorNEqual";
                          pcVar3 = "";
                        }
                        else {
                          local_20.begin = "<<";
                          local_20.end = "";
                          bVar1 = InplaceStr::operator==(&local_10,&local_20);
                          if (bVar1) {
                            pcVar2 = "__operatorShiftLeft";
                            pcVar3 = "";
                          }
                          else {
                            local_20.begin = ">>";
                            local_20.end = "";
                            bVar1 = InplaceStr::operator==(&local_10,&local_20);
                            if (bVar1) {
                              pcVar2 = "__operatorShiftRight";
                              pcVar3 = "";
                            }
                            else {
                              local_20.begin = "&";
                              local_20.end = "";
                              bVar1 = InplaceStr::operator==(&local_10,&local_20);
                              if (bVar1) {
                                pcVar2 = "__operatorBitAnd";
                                pcVar3 = "";
                              }
                              else {
                                local_20.begin = "|";
                                local_20.end = "";
                                bVar1 = InplaceStr::operator==(&local_10,&local_20);
                                if (bVar1) {
                                  pcVar2 = "__operatorBitOr";
                                  pcVar3 = "";
                                }
                                else {
                                  local_20.begin = "^";
                                  local_20.end = "";
                                  bVar1 = InplaceStr::operator==(&local_10,&local_20);
                                  if (bVar1) {
                                    pcVar2 = "__operatorBitXor";
                                    pcVar3 = "";
                                  }
                                  else {
                                    local_20.begin = "&&";
                                    local_20.end = "";
                                    bVar1 = InplaceStr::operator==(&local_10,&local_20);
                                    if (bVar1) {
                                      pcVar2 = "__operatorLogAnd";
                                      pcVar3 = "";
                                    }
                                    else {
                                      local_20.begin = "||";
                                      local_20.end = "";
                                      bVar1 = InplaceStr::operator==(&local_10,&local_20);
                                      if (bVar1) {
                                        pcVar2 = "__operatorLogOr";
                                        pcVar3 = "";
                                      }
                                      else {
                                        local_20.begin = "^^";
                                        local_20.end = "";
                                        bVar1 = InplaceStr::operator==(&local_10,&local_20);
                                        if (bVar1) {
                                          pcVar2 = "__operatorLogXor";
                                          pcVar3 = "";
                                        }
                                        else {
                                          local_20.begin = "=";
                                          local_20.end = "";
                                          bVar1 = InplaceStr::operator==(&local_10,&local_20);
                                          if (bVar1) {
                                            pcVar2 = "__operatorSet";
                                            pcVar3 = "";
                                          }
                                          else {
                                            local_20.begin = "+=";
                                            local_20.end = "";
                                            bVar1 = InplaceStr::operator==(&local_10,&local_20);
                                            if (bVar1) {
                                              pcVar2 = "__operatorAddSet";
                                              pcVar3 = "";
                                            }
                                            else {
                                              local_20.begin = "-=";
                                              local_20.end = "";
                                              bVar1 = InplaceStr::operator==(&local_10,&local_20);
                                              if (bVar1) {
                                                pcVar2 = "__operatorSubSet";
                                                pcVar3 = "";
                                              }
                                              else {
                                                local_20.begin = "*=";
                                                local_20.end = "";
                                                bVar1 = InplaceStr::operator==(&local_10,&local_20);
                                                if (bVar1) {
                                                  pcVar2 = "__operatorMulSet";
                                                  pcVar3 = "";
                                                }
                                                else {
                                                  local_20.begin = "/=";
                                                  local_20.end = "";
                                                  bVar1 = InplaceStr::operator==
                                                                    (&local_10,&local_20);
                                                  if (bVar1) {
                                                    pcVar2 = "__operatorDivSet";
                                                    pcVar3 = "";
                                                  }
                                                  else {
                                                    local_20.begin = "**=";
                                                    local_20.end = "";
                                                    bVar1 = InplaceStr::operator==
                                                                      (&local_10,&local_20);
                                                    if (bVar1) {
                                                      pcVar2 = "__operatorPowSet";
                                                      pcVar3 = "";
                                                    }
                                                    else {
                                                      local_20.begin = "%=";
                                                      local_20.end = "";
                                                      bVar1 = InplaceStr::operator==
                                                                        (&local_10,&local_20);
                                                      if (bVar1) {
                                                        pcVar2 = "__operatorModSet";
                                                        pcVar3 = "";
                                                      }
                                                      else {
                                                        local_20.begin = "<<=";
                                                        local_20.end = "";
                                                        bVar1 = InplaceStr::operator==
                                                                          (&local_10,&local_20);
                                                        if (bVar1) {
                                                          pcVar2 = "__operatorShlSet";
                                                          pcVar3 = "";
                                                        }
                                                        else {
                                                          local_20.begin = ">>=";
                                                          local_20.end = "";
                                                          bVar1 = InplaceStr::operator==
                                                                            (&local_10,&local_20);
                                                          if (bVar1) {
                                                            pcVar2 = "__operatorShrSet";
                                                            pcVar3 = "";
                                                          }
                                                          else {
                                                            local_20.begin = "&=";
                                                            local_20.end = "";
                                                            bVar1 = InplaceStr::operator==
                                                                              (&local_10,&local_20);
                                                            if (bVar1) {
                                                              pcVar2 = "__operatorAndSet";
                                                              pcVar3 = "";
                                                            }
                                                            else {
                                                              local_20.begin = "|=";
                                                              local_20.end = "";
                                                              bVar1 = InplaceStr::operator==
                                                                                (&local_10,&local_20
                                                                                );
                                                              if (bVar1) {
                                                                pcVar2 = "__operatorOrSet";
                                                                pcVar3 = "";
                                                              }
                                                              else {
                                                                local_20.begin = "^=";
                                                                local_20.end = "";
                                                                bVar1 = InplaceStr::operator==
                                                                                  (&local_10,
                                                                                   &local_20);
                                                                if (bVar1) {
                                                                  pcVar2 = "__operatorXorSet";
                                                                  pcVar3 = "";
                                                                }
                                                                else {
                                                                  local_20.begin = "[]";
                                                                  local_20.end = "";
                                                                  bVar1 = InplaceStr::operator==
                                                                                    (&local_10,
                                                                                     &local_20);
                                                                  if (bVar1) {
                                                                    pcVar2 = "__operatorIndex";
                                                                    pcVar3 = "";
                                                                  }
                                                                  else {
                                                                    local_20.begin = "!";
                                                                    local_20.end = "";
                                                                    bVar1 = InplaceStr::operator==
                                                                                      (&local_10,
                                                                                       &local_20);
                                                                    if (bVar1) {
                                                                      pcVar2 = "__operatorLogNot";
                                                                      pcVar3 = "";
                                                                    }
                                                                    else {
                                                                      local_20.begin = "~";
                                                                      local_20.end = "";
                                                                      bVar1 = InplaceStr::operator==
                                                                                        (&local_10,
                                                                                         &local_20);
                                                                      if (bVar1) {
                                                                        pcVar2 = "__operatorBitNot";
                                                                        pcVar3 = "";
                                                                      }
                                                                      else {
                                                                        local_20.begin = "()";
                                                                        local_20.end = "";
                                                                        bVar1 = InplaceStr::
                                                                                operator==(&local_10
                                                  ,&local_20);
                                                  pcVar2 = "__operatorFuncCall";
                                                  if (!bVar1) {
                                                    pcVar2 = (char *)0x0;
                                                  }
                                                  pcVar3 = "";
                                                  if (!bVar1) {
                                                    pcVar3 = (char *)0x0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  IVar4.end = pcVar3;
  IVar4.begin = pcVar2;
  return IVar4;
}

Assistant:

InplaceStr GetOperatorName(InplaceStr name)
{
	if(name == InplaceStr("+"))
		return InplaceStr("__operatorAdd");

	if(name == InplaceStr("-"))
		return InplaceStr("__operatorSub");

	if(name == InplaceStr("*"))
		return InplaceStr("__operatorMul");

	if(name == InplaceStr("/"))
		return InplaceStr("__operatorDiv");

	if(name == InplaceStr("%"))
		return InplaceStr("__operatorMod");

	if(name == InplaceStr("**"))
		return InplaceStr("__operatorPow");

	if(name == InplaceStr("<"))
		return InplaceStr("__operatorLess");

	if(name == InplaceStr(">"))
		return InplaceStr("__operatorGreater");

	if(name == InplaceStr("<="))
		return InplaceStr("__operatorLEqual");

	if(name == InplaceStr(">="))
		return InplaceStr("__operatorGEqual");

	if(name == InplaceStr("=="))
		return InplaceStr("__operatorEqual");

	if(name == InplaceStr("!="))
		return InplaceStr("__operatorNEqual");

	if(name == InplaceStr("<<"))
		return InplaceStr("__operatorShiftLeft");

	if(name == InplaceStr(">>"))
		return InplaceStr("__operatorShiftRight");

	if(name == InplaceStr("&"))
		return InplaceStr("__operatorBitAnd");

	if(name == InplaceStr("|"))
		return InplaceStr("__operatorBitOr");

	if(name == InplaceStr("^"))
		return InplaceStr("__operatorBitXor");

	if(name == InplaceStr("&&"))
		return InplaceStr("__operatorLogAnd");

	if(name == InplaceStr("||"))
		return InplaceStr("__operatorLogOr");

	if(name == InplaceStr("^^"))
		return InplaceStr("__operatorLogXor");

	if(name == InplaceStr("="))
		return InplaceStr("__operatorSet");

	if(name == InplaceStr("+="))
		return InplaceStr("__operatorAddSet");

	if(name == InplaceStr("-="))
		return InplaceStr("__operatorSubSet");

	if(name == InplaceStr("*="))
		return InplaceStr("__operatorMulSet");

	if(name == InplaceStr("/="))
		return InplaceStr("__operatorDivSet");

	if(name == InplaceStr("**="))
		return InplaceStr("__operatorPowSet");

	if(name == InplaceStr("%="))
		return InplaceStr("__operatorModSet");

	if(name == InplaceStr("<<="))
		return InplaceStr("__operatorShlSet");

	if(name == InplaceStr(">>="))
		return InplaceStr("__operatorShrSet");

	if(name == InplaceStr("&="))
		return InplaceStr("__operatorAndSet");

	if(name == InplaceStr("|="))
		return InplaceStr("__operatorOrSet");

	if(name == InplaceStr("^="))
		return InplaceStr("__operatorXorSet");

	if(name == InplaceStr("[]"))
		return InplaceStr("__operatorIndex");

	if(name == InplaceStr("!"))
		return InplaceStr("__operatorLogNot");

	if(name == InplaceStr("~"))
		return InplaceStr("__operatorBitNot");

	if(name == InplaceStr("()"))
		return InplaceStr("__operatorFuncCall");

	return InplaceStr();
}